

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O2

CExtKey * DecodeExtKey(CExtKey *__return_storage_ptr__,string *str)

{
  ChainCode *pCVar1;
  long lVar2;
  uchar *__first1;
  uchar *__last1;
  base_blob<256U> *pbVar3;
  bool bVar4;
  CChainParams *pCVar5;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = &(__return_storage_ptr__->chaincode).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &(__return_storage_ptr__->chaincode).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  pCVar1 = &__return_storage_ptr__->chaincode;
  (pCVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &(__return_storage_ptr__->chaincode).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  (__return_storage_ptr__->key).fCompressed = false;
  (__return_storage_ptr__->key).keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_32UL> *)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = DecodeBase58Check(str,&data,0x4e);
  if (bVar4) {
    pCVar5 = Params();
    __first1 = pCVar5->base58Prefixes[4].
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    __last1 = pCVar5->base58Prefixes[4].
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
        -(long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start == __last1 + (0x4a - (long)__first1)) {
      bVar4 = std::__equal<true>::equal<unsigned_char>
                        (__first1,__last1,
                         data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      if (bVar4) {
        CExtKey::Decode(__return_storage_ptr__,
                        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                        ((long)pCVar5->base58Prefixes[4].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)pCVar5->base58Prefixes[4].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start));
      }
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CExtKey DecodeExtKey(const std::string& str)
{
    CExtKey key;
    std::vector<unsigned char> data;
    if (DecodeBase58Check(str, data, 78)) {
        const std::vector<unsigned char>& prefix = Params().Base58Prefix(CChainParams::EXT_SECRET_KEY);
        if (data.size() == BIP32_EXTKEY_SIZE + prefix.size() && std::equal(prefix.begin(), prefix.end(), data.begin())) {
            key.Decode(data.data() + prefix.size());
        }
    }
    return key;
}